

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O3

void start_input_bmp(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int *piVar1;
  jpeg_error_mgr *pjVar2;
  undefined8 *puVar3;
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  J_COLOR_SPACE JVar8;
  cd_progress_ptr progress;
  size_t sVar9;
  JSAMPARRAY ppJVar10;
  jvirt_sarray_ptr pjVar11;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var12;
  code *pcVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  U_CHAR bmpinfoheader [64];
  U_CHAR bmpfileheader [14];
  short local_a6;
  int local_88;
  uint local_84;
  undefined4 local_80;
  short local_7c;
  ushort local_7a;
  int local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  short local_3e [5];
  int local_34;
  
  sVar9 = fread(local_3e,1,0xe,(FILE *)sinfo->input_file);
  if (sVar9 != 0xe) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (local_3e[0] != 0x4d42) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3f0;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  sVar9 = fread(&local_88,1,4,(FILE *)sinfo->input_file);
  if (sVar9 != 4) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((local_88 - 0x41U < 0xffffffcb) || (local_34 < local_88 + 0xe)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3eb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  sVar9 = fread(&local_84,1,(long)(local_88 + -4),(FILE *)sinfo->input_file);
  if (sVar9 != (long)(local_88 + -4)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((local_88 == 0x40) || (local_88 == 0x28)) {
    local_a6 = local_7c;
    *(uint *)&sinfo[1].buffer = (uint)local_7a;
    if ((local_7a == 0x20) || (local_7a == 0x18)) {
      pjVar2 = cinfo->err;
      (pjVar2->msg_parm).i[0] = local_84;
      (pjVar2->msg_parm).i[1] = local_80;
      (pjVar2->msg_parm).i[2] = *(int *)&sinfo[1].buffer;
      pjVar2->msg_code = 0x3f2;
      (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
LAB_00140e05:
      iVar7 = 0;
    }
    else {
      if (local_7a != 8) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3ea;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
        goto LAB_00140e05;
      }
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3f3;
      (pjVar2->msg_parm).i[0] = local_84;
      (cinfo->err->msg_parm).i[1] = local_80;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      iVar7 = 4;
    }
    if (local_78 != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3ee;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    uVar18 = local_80;
    uVar17 = local_68;
    uVar14 = local_84;
    if ((0 < (int)local_70) && (0 < (int)local_6c)) {
      cinfo->X_density = (UINT16)(local_70 / 100);
      cinfo->Y_density = (UINT16)(local_6c / 100);
      cinfo->density_unit = '\x02';
    }
  }
  else {
    if (local_88 != 0xc) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3eb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
      return;
    }
    uVar18 = local_84 >> 0x10;
    *(uint *)&sinfo[1].buffer = (uint)local_80._2_2_;
    local_a6 = (short)local_80;
    uVar14 = local_84 & 0xffff;
    if ((local_80._2_2_ == 0x20) || (local_80._2_2_ == 0x18)) {
      pjVar2 = cinfo->err;
      (pjVar2->msg_parm).i[0] = local_84 & 0xffff;
      (pjVar2->msg_parm).i[1] = uVar18;
      (pjVar2->msg_parm).i[2] = *(int *)&sinfo[1].buffer;
      pjVar2->msg_code = 0x3f4;
      (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
    }
    else {
      if (local_80._2_2_ == 8) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3f5;
        (pjVar2->msg_parm).i[0] = local_84 & 0xffff;
        (cinfo->err->msg_parm).i[1] = uVar18;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        iVar7 = 3;
        uVar17 = 0;
        goto LAB_00140e89;
      }
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3ea;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    iVar7 = 0;
    uVar17 = 0;
  }
LAB_00140e89:
  if (((int)uVar14 < 1) || ((int)uVar18 < 1)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ef;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (local_a6 != 1) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ec;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  iVar16 = local_34 - (local_88 + 0xe);
  if (iVar7 != 0) {
    if ((int)uVar17 < 1) {
      uVar17 = 0x100;
    }
    else if (0x100 < uVar17) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3e9;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    bVar5 = true;
    ppJVar10 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,uVar17,3);
    sinfo[1].get_pixel_rows = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)ppJVar10;
    *(uint *)((long)&sinfo[1].buffer + 4) = uVar17;
    if (iVar7 == 3) {
      uVar15 = 0;
      do {
        iVar6 = getc((FILE *)sinfo->input_file);
        if (iVar6 == -1) {
          puVar3 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar3 + 5) = 0x2b;
          (*(code *)*puVar3)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar15) = (char)iVar6;
        iVar6 = getc((FILE *)sinfo->input_file);
        if (iVar6 == -1) {
          puVar3 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar3 + 5) = 0x2b;
          (*(code *)*puVar3)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar15) = (char)iVar6;
        iVar6 = getc((FILE *)sinfo->input_file);
        if (iVar6 == -1) {
          puVar3 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar3 + 5) = 0x2b;
          (*(code *)*puVar3)();
        }
        *(char *)(*(long *)sinfo[1].get_pixel_rows + uVar15) = (char)iVar6;
        p_Var4 = sinfo[1].get_pixel_rows;
        if ((*(char *)(*(long *)(p_Var4 + 0x10) + uVar15) !=
             *(char *)(*(long *)(p_Var4 + 8) + uVar15)) ||
           (*(char *)(*(long *)(p_Var4 + 0x10) + uVar15) != *(char *)(*(long *)p_Var4 + uVar15))) {
          bVar5 = false;
        }
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
    }
    else if (iVar7 == 4) {
      bVar5 = true;
      uVar15 = 0;
      do {
        iVar6 = getc((FILE *)sinfo->input_file);
        if (iVar6 == -1) {
          puVar3 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar3 + 5) = 0x2b;
          (*(code *)*puVar3)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar15) = (char)iVar6;
        iVar6 = getc((FILE *)sinfo->input_file);
        if (iVar6 == -1) {
          puVar3 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar3 + 5) = 0x2b;
          (*(code *)*puVar3)();
        }
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar15) = (char)iVar6;
        iVar6 = getc((FILE *)sinfo->input_file);
        if (iVar6 == -1) {
          puVar3 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar3 + 5) = 0x2b;
          (*(code *)*puVar3)();
        }
        *(char *)(*(long *)sinfo[1].get_pixel_rows + uVar15) = (char)iVar6;
        iVar6 = getc((FILE *)sinfo->input_file);
        if (iVar6 == -1) {
          puVar3 = *(undefined8 **)sinfo[1].start_input;
          *(undefined4 *)(puVar3 + 5) = 0x2b;
          (*(code *)*puVar3)();
        }
        p_Var4 = sinfo[1].get_pixel_rows;
        if ((*(char *)(*(long *)(p_Var4 + 0x10) + uVar15) !=
             *(char *)(*(long *)(p_Var4 + 8) + uVar15)) ||
           (*(char *)(*(long *)(p_Var4 + 0x10) + uVar15) != *(char *)(*(long *)p_Var4 + uVar15))) {
          bVar5 = false;
        }
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
    }
    else {
      puVar3 = *(undefined8 **)sinfo[1].start_input;
      *(undefined4 *)(puVar3 + 5) = 0x3e9;
      (*(code *)*puVar3)();
      bVar5 = true;
    }
    p_Var12 = sinfo[1].start_input;
    if (bVar5 && *(int *)(p_Var12 + 0x3c) == 0) {
      *(undefined4 *)(p_Var12 + 0x3c) = 1;
    }
    else if (*(int *)(p_Var12 + 0x3c) == 1 && !bVar5) {
      puVar3 = *(undefined8 **)p_Var12;
      *(undefined4 *)(puVar3 + 5) = 9;
      (*(code *)*puVar3)();
    }
    iVar16 = iVar16 - uVar17 * iVar7;
  }
  if (iVar16 < 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3eb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  else if (iVar16 != 0) {
    uVar17 = iVar16 + 1;
    do {
      iVar7 = getc((FILE *)sinfo->input_file);
      if (iVar7 == -1) {
        puVar3 = *(undefined8 **)sinfo[1].start_input;
        *(undefined4 *)(puVar3 + 5) = 0x2b;
        (*(code *)*puVar3)();
      }
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
  }
  iVar7 = *(int *)&sinfo[1].buffer;
  uVar15 = (ulong)(int)uVar14;
  if (iVar7 == 0x20) {
    JVar8 = cinfo->in_color_space;
    if (JVar8 == JCS_UNKNOWN) {
      cinfo->in_color_space = JCS_EXT_BGRA;
      JVar8 = JCS_EXT_BGRA;
LAB_00141286:
      cinfo->input_components = rgb_pixelsize[JVar8];
    }
    else {
      if ((JVar8 == JCS_RGB) || (JVar8 - JCS_EXT_RGB < 10)) goto LAB_00141286;
      if (JVar8 == JCS_CMYK) {
        cinfo->input_components = 4;
      }
      else {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 9;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
    }
    if ((int)(uVar15 >> 0x1e) != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x46;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    uVar17 = uVar14 * 4;
  }
  else if (iVar7 == 0x18) {
    JVar8 = cinfo->in_color_space;
    if (JVar8 == JCS_UNKNOWN) {
      cinfo->in_color_space = JCS_EXT_BGR;
      JVar8 = JCS_EXT_BGR;
LAB_0014124a:
      cinfo->input_components = rgb_pixelsize[JVar8];
    }
    else {
      if ((JVar8 == JCS_RGB) || (JVar8 - JCS_EXT_RGB < 10)) goto LAB_0014124a;
      if (JVar8 == JCS_CMYK) {
        cinfo->input_components = 4;
      }
      else {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 9;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
    }
    if (uVar15 * 3 >> 0x20 != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x46;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    uVar17 = uVar14 * 3;
  }
  else if (iVar7 == 8) {
    JVar8 = cinfo->in_color_space;
    uVar17 = uVar14;
    if (JVar8 != JCS_RGB) {
      if (JVar8 == JCS_UNKNOWN) {
        cinfo->in_color_space = JCS_EXT_RGB;
        JVar8 = JCS_EXT_RGB;
      }
      else if (9 < JVar8 - JCS_EXT_RGB) {
        if (JVar8 == JCS_CMYK) {
          cinfo->input_components = 4;
        }
        else if (JVar8 == JCS_GRAYSCALE) {
          cinfo->input_components = 1;
        }
        else {
          pjVar2 = cinfo->err;
          pjVar2->msg_code = 9;
          (*pjVar2->error_exit)((j_common_ptr)cinfo);
        }
        goto LAB_001412d8;
      }
    }
    cinfo->input_components = rgb_pixelsize[JVar8];
  }
  else {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ea;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
    uVar17 = 0;
  }
LAB_001412d8:
  uVar17 = (-uVar17 & 3) + uVar17;
  *(uint *)((long)&sinfo[1].input_file + 4) = uVar17;
  if (sinfo[1].buffer_height == 0) {
    p_Var12 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
              (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(ulong)uVar17);
    sinfo[2].start_input = p_Var12;
    iVar7 = *(int *)&sinfo[1].buffer;
    if (iVar7 == 0x20) {
      pcVar13 = get_32bit_row;
    }
    else if (iVar7 == 0x18) {
      pcVar13 = get_24bit_row;
    }
    else {
      if (iVar7 != 8) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3ea;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
        goto LAB_00141375;
      }
      pcVar13 = get_8bit_row;
    }
    sinfo->get_pixel_rows = pcVar13;
  }
  else {
    pjVar11 = (*cinfo->mem->request_virt_sarray)((j_common_ptr)cinfo,1,0,uVar17,uVar18,1);
    sinfo[1].finish_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)pjVar11;
    sinfo->get_pixel_rows = preload_image;
    if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
      piVar1 = (int *)((long)&cinfo->progress[1].progress_monitor + 4);
      *piVar1 = *piVar1 + 1;
    }
  }
LAB_00141375:
  iVar7 = cinfo->input_components;
  if (uVar15 * (long)iVar7 >> 0x20 != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x46;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
    iVar7 = cinfo->input_components;
  }
  ppJVar10 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,iVar7 * uVar14,1);
  sinfo->buffer = ppJVar10;
  sinfo->buffer_height = 1;
  cinfo->data_precision = 8;
  cinfo->image_width = uVar14;
  cinfo->image_height = uVar18;
  return;
}

Assistant:

METHODDEF(void)
start_input_bmp(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  U_CHAR bmpfileheader[14];
  U_CHAR bmpinfoheader[64];

#define GET_2B(array, offset) \
  ((unsigned short)UCH(array[offset]) + \
   (((unsigned short)UCH(array[offset + 1])) << 8))
#define GET_4B(array, offset) \
  ((unsigned int)UCH(array[offset]) + \
   (((unsigned int)UCH(array[offset + 1])) << 8) + \
   (((unsigned int)UCH(array[offset + 2])) << 16) + \
   (((unsigned int)UCH(array[offset + 3])) << 24))

  int bfOffBits;
  int headerSize;
  int biWidth;
  int biHeight;
  unsigned short biPlanes;
  unsigned int biCompression;
  int biXPelsPerMeter, biYPelsPerMeter;
  int biClrUsed = 0;
  int mapentrysize = 0;         /* 0 indicates no colormap */
  int bPad;
  JDIMENSION row_width = 0;

  /* Read and verify the bitmap file header */
  if (!ReadOK(source->pub.input_file, bmpfileheader, 14))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  if (GET_2B(bmpfileheader, 0) != 0x4D42) /* 'BM' */
    ERREXIT(cinfo, JERR_BMP_NOT);
  bfOffBits = GET_4B(bmpfileheader, 10);
  /* We ignore the remaining fileheader fields */

  /* The infoheader might be 12 bytes (OS/2 1.x), 40 bytes (Windows),
   * or 64 bytes (OS/2 2.x).  Check the first 4 bytes to find out which.
   */
  if (!ReadOK(source->pub.input_file, bmpinfoheader, 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  headerSize = GET_4B(bmpinfoheader, 0);
  if (headerSize < 12 || headerSize > 64 || (headerSize + 14) > bfOffBits)
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  if (!ReadOK(source->pub.input_file, bmpinfoheader + 4, headerSize - 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);

  switch (headerSize) {
  case 12:
    /* Decode OS/2 1.x header (Microsoft calls this a BITMAPCOREHEADER) */
    biWidth = (int)GET_2B(bmpinfoheader, 4);
    biHeight = (int)GET_2B(bmpinfoheader, 6);
    biPlanes = GET_2B(bmpinfoheader, 8);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 10);

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 3;         /* OS/2 uses RGBTRIPLE colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_OS2_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP_OS2, biWidth, biHeight,
               source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    break;
  case 40:
  case 64:
    /* Decode Windows 3.x header (Microsoft calls this a BITMAPINFOHEADER) */
    /* or OS/2 2.x header, which has additional fields that we ignore */
    biWidth = (int)GET_4B(bmpinfoheader, 4);
    biHeight = (int)GET_4B(bmpinfoheader, 8);
    biPlanes = GET_2B(bmpinfoheader, 12);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 14);
    biCompression = GET_4B(bmpinfoheader, 16);
    biXPelsPerMeter = (int)GET_4B(bmpinfoheader, 24);
    biYPelsPerMeter = (int)GET_4B(bmpinfoheader, 28);
    biClrUsed = GET_4B(bmpinfoheader, 32);
    /* biSizeImage, biClrImportant fields are ignored */

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 4;         /* Windows uses RGBQUAD colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP, biWidth, biHeight, source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    if (biCompression != 0)
      ERREXIT(cinfo, JERR_BMP_COMPRESSED);

    if (biXPelsPerMeter > 0 && biYPelsPerMeter > 0) {
      /* Set JFIF density parameters from the BMP data */
      cinfo->X_density = (UINT16)(biXPelsPerMeter / 100); /* 100 cm per meter */
      cinfo->Y_density = (UINT16)(biYPelsPerMeter / 100);
      cinfo->density_unit = 2;  /* dots/cm */
    }
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
    return;
  }

  if (biWidth <= 0 || biHeight <= 0)
    ERREXIT(cinfo, JERR_BMP_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)biWidth * biHeight > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
  if (biPlanes != 1)
    ERREXIT(cinfo, JERR_BMP_BADPLANES);

  /* Compute distance to bitmap data --- will adjust for colormap below */
  bPad = bfOffBits - (headerSize + 14);

  /* Read the colormap, if any */
  if (mapentrysize > 0) {
    if (biClrUsed <= 0)
      biClrUsed = 256;          /* assume it's 256 */
    else if (biClrUsed > 256)
      ERREXIT(cinfo, JERR_BMP_BADCMAP);
    /* Allocate space to store the colormap */
    source->colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)biClrUsed, (JDIMENSION)3);
    source->cmap_length = (int)biClrUsed;
    /* and read it from the file */
    read_colormap(source, (int)biClrUsed, mapentrysize);
    /* account for size of colormap */
    bPad -= biClrUsed * mapentrysize;
  }

  /* Skip any remaining pad bytes */
  if (bPad < 0)                 /* incorrect bfOffBits value? */
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  while (--bPad >= 0) {
    (void)read_byte(source);
  }

  /* Compute row width in file, including padding to 4-byte boundary */
  switch (source->bits_per_pixel) {
  case 8:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_RGB;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_GRAYSCALE)
      cinfo->input_components = 1;
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    row_width = (JDIMENSION)biWidth;
    break;
  case 24:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGR;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 3ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 3;
    break;
  case 32:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGRA;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 4ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 4;
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADDEPTH);
  }
  while ((row_width & 3) != 0) row_width++;
  source->row_width = row_width;

  if (source->use_inversion_array) {
    /* Allocate space for inversion array, prepare for preload pass */
    source->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       row_width, (JDIMENSION)biHeight, (JDIMENSION)1);
    source->pub.get_pixel_rows = preload_image;
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
  } else {
    source->iobuffer = (U_CHAR *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE, row_width);
    switch (source->bits_per_pixel) {
    case 8:
      source->pub.get_pixel_rows = get_8bit_row;
      break;
    case 24:
      source->pub.get_pixel_rows = get_24bit_row;
      break;
    case 32:
      source->pub.get_pixel_rows = get_32bit_row;
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
    }
  }

  /* Ensure that biWidth * cinfo->input_components doesn't exceed the maximum
     value of the JDIMENSION type.  This is only a danger with BMP files, since
     their width and height fields are 32-bit integers. */
  if ((unsigned long long)biWidth *
      (unsigned long long)cinfo->input_components > 0xFFFFFFFFULL)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  /* Allocate one-row buffer for returned data */
  source->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)biWidth * (JDIMENSION)cinfo->input_components, (JDIMENSION)1);
  source->pub.buffer_height = 1;

  cinfo->data_precision = 8;
  cinfo->image_width = (JDIMENSION)biWidth;
  cinfo->image_height = (JDIMENSION)biHeight;
}